

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgstr(fitsfile *fptr,char *string,char *card,int *status)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int *in_RCX;
  char *in_RDX;
  char *in_RSI;
  int kk;
  int jj;
  int stringlen;
  int ntodo;
  int nextkey;
  int nkeys;
  char *in_stack_00000040;
  fitsfile *in_stack_00000048;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffcc;
  int local_30;
  int local_2c;
  int local_4;
  
  if (*in_RCX < 1) {
    sVar2 = strlen(in_RSI);
    if ((int)sVar2 < 0x51) {
      ffghps((fitsfile *)CONCAT44(in_stack_ffffffffffffffcc,(int)sVar2),
             (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(int *)0x1c7528);
      iVar1 = (local_2c - local_30) + 1;
      for (iVar5 = 0; iVar5 < 2; iVar5 = iVar5 + 1) {
        for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
          ffgnky(in_stack_00000048,in_stack_00000040,&fptr->HDUposition);
          pcVar3 = strstr(in_RDX,in_RSI);
          if (pcVar3 != (char *)0x0) {
            return *in_RCX;
          }
        }
        ffmaky((fitsfile *)CONCAT44(iVar5,iVar4),in_stack_ffffffffffffffbc,(int *)0x1c75b5);
        iVar1 = local_30 + -1;
      }
      *in_RCX = 0xca;
      local_4 = 0xca;
    }
    else {
      *in_RCX = 0xca;
      local_4 = 0xca;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgstr( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *string, /* I - string to match  */
            char *card,         /* O - keyword card             */
            int  *status)       /* IO - error status            */
/*
  Read (get) the next keyword record that contains the input character string,
  returning the entire keyword card up to 80 characters long.
  The returned card value is null terminated with any trailing blank 
  characters removed.
*/
{
    int nkeys, nextkey, ntodo, stringlen;
    int jj, kk;

    if (*status > 0)
        return(*status);

    stringlen = strlen(string);
    if (stringlen > 80) {
        return(*status = KEY_NO_EXIST);  /* matching string is too long to exist */
    }

    ffghps(fptr, &nkeys, &nextkey, status); /* get no. keywords and position */
    ntodo = nkeys - nextkey + 1;  /* first, read from next keyword to end */

    for (jj=0; jj < 2; jj++)
    {
      for (kk = 0; kk < ntodo; kk++)
      {
        ffgnky(fptr, card, status);     /* get next keyword */
        if (strstr(card, string) != 0) {
            return(*status);   /* found the matching string */
        }
      }

      ffmaky(fptr, 1, status);  /* reset pointer to beginning of header */
      ntodo = nextkey - 1;      /* number of keyword to read */ 
    }

    return(*status = KEY_NO_EXIST);  /* couldn't find the keyword */
}